

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-execution.h
# Opt level: O1

void wasm::
     LinearExecutionWalker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
     ::scan(ConstantGlobalApplier *self,Expression **currp)

{
  Id IVar1;
  Expression *pEVar2;
  char *__function;
  Expression *pEVar3;
  undefined1 *puVar4;
  code *pcVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  _func_void_ConstantGlobalApplier_ptr_Expression_ptr_ptr *local_40;
  Expression *local_38;
  
  pEVar2 = *currp;
  IVar1 = pEVar2->_id;
  switch(IVar1) {
  case InvalidId:
    handle_unreachable("bad id",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/linear-execution.h"
                       ,0x62);
  case BlockId:
    puVar4 = &self->field_0x58;
    Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
    ::pushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                *)puVar4,
               Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
               ::doVisitBlock,currp);
    if (pEVar2->_id == BlockId) {
      if (pEVar2[1].type.id != 0) {
        Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
        ::pushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                    *)puVar4,anon_unknown_163::ConstantGlobalApplier::doNoteNonLinear,currp);
      }
      if (pEVar2->_id == BlockId) {
        uVar6 = (uint)pEVar2[2].type.id;
        if ((int)uVar6 < 1) {
          return;
        }
        uVar7 = (ulong)(uVar6 & 0x7fffffff);
        lVar9 = uVar7 * 8;
        lVar8 = uVar7 + 1;
        while (lVar9 = lVar9 + -8, lVar8 - 2U < pEVar2[2].type.id) {
          Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
          ::pushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                      *)puVar4,scan,(Expression **)(*(long *)(pEVar2 + 2) + lVar9));
          lVar8 = lVar8 + -1;
          if (lVar8 < 2) {
            return;
          }
        }
LAB_00b0c74d:
        __assert_fail("index < usedElements",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                      ,0xbc,
                      "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                     );
      }
    }
    __function = "T *wasm::Expression::cast() [T = wasm::Block]";
    goto LAB_00b0c874;
  case IfId:
    puVar4 = &self->field_0x58;
    Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
    ::pushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                *)puVar4,
               Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
               ::doVisitIf,currp);
    Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
    ::pushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                *)puVar4,anon_unknown_163::ConstantGlobalApplier::doNoteNonLinear,currp);
    if (pEVar2->_id == IfId) {
      local_38 = pEVar2 + 2;
      local_40 = scan;
      if (*(long *)(pEVar2 + 2) != 0) {
        SmallVector<wasm::Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,void>>::Task,10ul>
        ::
        emplace_back<void(*&)(wasm::(anonymous_namespace)::ConstantGlobalApplier*,wasm::Expression**),wasm::Expression**&>
                  ((SmallVector<wasm::Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,void>>::Task,10ul>
                    *)&self->field_0x60,&local_40,(Expression ***)&local_38);
      }
      Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
      ::pushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                  *)puVar4,anon_unknown_163::ConstantGlobalApplier::doNoteNonLinear,currp);
      if (pEVar2->_id == IfId) {
        Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
        ::pushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                    *)puVar4,scan,(Expression **)&pEVar2[1].type);
        if (self->connectAdjacentBlocks == false) {
          Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
          ::pushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                      *)puVar4,anon_unknown_163::ConstantGlobalApplier::doNoteNonLinear,currp);
        }
        if (pEVar2->_id == IfId) {
          currp = (Expression **)(pEVar2 + 1);
          goto LAB_00b0c737;
        }
      }
    }
    __function = "T *wasm::Expression::cast() [T = wasm::If]";
    goto LAB_00b0c874;
  case LoopId:
    Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
    ::pushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                *)&self->field_0x58,
               Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
               ::doVisitLoop,currp);
    if (pEVar2->_id != LoopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Loop]";
      goto LAB_00b0c874;
    }
    pcVar5 = scan;
    pEVar3 = pEVar2 + 2;
    goto LAB_00b0c5b3;
  case BreakId:
    Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
    ::pushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                *)&self->field_0x58,
               Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
               ::doVisitBreak,currp);
    if (pEVar2->_id != BreakId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Break]";
      goto LAB_00b0c874;
    }
    if ((pEVar2[2].type.id == 0) || (self->connectAdjacentBlocks == false)) {
      Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
      ::pushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                  *)&self->field_0x58,anon_unknown_163::ConstantGlobalApplier::doNoteNonLinear,currp
                );
    }
    local_40 = scan;
    if (pEVar2[2].type.id != 0) {
      local_38 = (Expression *)&pEVar2[2].type;
      SmallVector<wasm::Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::(anonymous_namespace)::ConstantGlobalApplier*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,void>>::Task,10ul>
                  *)&self->field_0x60,&local_40,(Expression ***)&local_38);
    }
    local_38 = pEVar2 + 2;
    if (*(long *)(pEVar2 + 2) == 0) {
      return;
    }
    goto LAB_00b0c589;
  case SwitchId:
    puVar4 = &self->field_0x58;
    Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
    ::pushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                *)puVar4,
               Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
               ::doVisitSwitch,currp);
    Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
    ::pushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                *)puVar4,anon_unknown_163::ConstantGlobalApplier::doNoteNonLinear,currp);
    if ((pEVar2->_id != SwitchId) ||
       (Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
        ::pushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                    *)puVar4,scan,(Expression **)&pEVar2[4].type), pEVar2->_id != SwitchId)) {
      __function = "T *wasm::Expression::cast() [T = wasm::Switch]";
      goto LAB_00b0c874;
    }
    local_38 = pEVar2 + 4;
    lVar9 = *(long *)(pEVar2 + 4);
    break;
  case CallId:
    if (self->connectAdjacentBlocks != false) goto switchD_00b0c1be_caseD_7;
    IVar1 = pEVar2[4]._id;
joined_r0x00b0c669:
    if (((IVar1 != InvalidId) || (*(long *)&self->field_0x128 == 0)) ||
       ((*(byte *)(*(long *)&self->field_0x128 + 0x178) & 0x40) != 0)) {
      Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
      ::pushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                  *)&self->field_0x58,anon_unknown_163::ConstantGlobalApplier::doNoteNonLinear,currp
                );
    }
switchD_00b0c1be_caseD_7:
    PostWalker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
    ::scan(self,currp);
    return;
  case CallIndirectId:
  case LocalGetId:
  case LocalSetId:
  case GlobalGetId:
  case GlobalSetId:
  case LoadId:
  case StoreId:
  case ConstId:
  case UnaryId:
  case BinaryId:
  case SelectId:
  case DropId:
    goto switchD_00b0c1be_caseD_7;
  case ReturnId:
    Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
    ::pushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                *)&self->field_0x58,
               Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
               ::doVisitReturn,currp);
    Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
    ::pushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                *)&self->field_0x58,anon_unknown_163::ConstantGlobalApplier::doNoteNonLinear,currp);
    if (pEVar2->_id != ReturnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Return]";
      goto LAB_00b0c874;
    }
    local_38 = pEVar2 + 1;
    lVar9 = *(long *)(pEVar2 + 1);
    break;
  default:
    pEVar3 = (Expression *)currp;
    switch(IVar1) {
    case TryId:
      puVar4 = &self->field_0x58;
      Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
      ::pushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                  *)puVar4,
                 Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                 ::doVisitTry,currp);
      Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
      ::pushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                  *)puVar4,anon_unknown_163::ConstantGlobalApplier::doNoteNonLinear,currp);
      if (pEVar2->_id == TryId) {
        if (0 < (int)(uint)*(undefined8 *)(pEVar2 + 5)) {
          uVar7 = (ulong)((uint)*(undefined8 *)(pEVar2 + 5) & 0x7fffffff);
          lVar9 = uVar7 * 8;
          lVar8 = uVar7 + 1;
          do {
            lVar9 = lVar9 + -8;
            if (*(ulong *)(pEVar2 + 5) <= lVar8 - 2U) goto LAB_00b0c74d;
            Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
            ::pushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                        *)puVar4,scan,(Expression **)(pEVar2[4].type.id + lVar9));
            Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
            ::pushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                        *)puVar4,anon_unknown_163::ConstantGlobalApplier::doNoteNonLinear,currp);
            lVar8 = lVar8 + -1;
          } while (1 < lVar8);
        }
        if (pEVar2->_id == TryId) {
          currp = (Expression **)(pEVar2 + 2);
          break;
        }
      }
      __function = "T *wasm::Expression::cast() [T = wasm::Try]";
LAB_00b0c874:
      __assert_fail("int(_id) == int(T::SpecificId)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                    ,0x31b,__function);
    case TryTableId:
      Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
      ::pushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                  *)&self->field_0x58,
                 Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                 ::doVisitTryTable,currp);
      Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
      ::pushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                  *)&self->field_0x58,anon_unknown_163::ConstantGlobalApplier::doNoteNonLinear,currp
                );
      if (pEVar2->_id != TryTableId) {
        __function = "T *wasm::Expression::cast() [T = wasm::TryTable]";
        goto LAB_00b0c874;
      }
      currp = (Expression **)(pEVar2 + 1);
      break;
    case ThrowId:
      puVar4 = &self->field_0x58;
      Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
      ::pushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                  *)puVar4,
                 Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                 ::doVisitThrow,currp);
      Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
      ::pushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                  *)puVar4,anon_unknown_163::ConstantGlobalApplier::doNoteNonLinear,currp);
      if (pEVar2->_id == ThrowId) {
        uVar6 = (uint)pEVar2[2].type.id;
        if ((int)uVar6 < 1) {
          return;
        }
        uVar7 = (ulong)(uVar6 & 0x7fffffff);
        lVar9 = uVar7 * 8;
        lVar8 = uVar7 + 1;
        while (lVar9 = lVar9 + -8, lVar8 - 2U < pEVar2[2].type.id) {
          Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
          ::pushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                      *)puVar4,scan,(Expression **)(*(long *)(pEVar2 + 2) + lVar9));
          lVar8 = lVar8 + -1;
          if (lVar8 < 2) {
            return;
          }
        }
        goto LAB_00b0c74d;
      }
      __function = "T *wasm::Expression::cast() [T = wasm::Throw]";
      goto LAB_00b0c874;
    case RethrowId:
      pcVar5 = Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
               ::doVisitRethrow;
      goto LAB_00b0c5b3;
    case ThrowRefId:
    case TupleMakeId:
    case TupleExtractId:
    case RefI31Id:
    case I31GetId:
    case RefTestId:
    case RefCastId:
      goto switchD_00b0c1be_caseD_7;
    case CallRefId:
      if (self->connectAdjacentBlocks != false) goto switchD_00b0c1be_caseD_7;
      IVar1 = (Id)pEVar2[3].type.id;
      goto joined_r0x00b0c669;
    case BrOnId:
      Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
      ::pushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                  *)&self->field_0x58,
                 Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                 ::doVisitBrOn,currp);
      if (self->connectAdjacentBlocks == false) {
        Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
        ::pushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                    *)&self->field_0x58,anon_unknown_163::ConstantGlobalApplier::doNoteNonLinear,
                   currp);
      }
      if (pEVar2->_id != BrOnId) {
        __function = "T *wasm::Expression::cast() [T = wasm::BrOn]";
        goto LAB_00b0c874;
      }
      currp = (Expression **)&pEVar2[2].type;
      break;
    default:
      if (IVar1 != UnreachableId) goto switchD_00b0c1be_caseD_7;
      pcVar5 = Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
               ::doVisitUnreachable;
LAB_00b0c5b3:
      Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
      ::pushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                  *)&self->field_0x58,pcVar5,(Expression **)pEVar3);
      pcVar5 = anon_unknown_163::ConstantGlobalApplier::doNoteNonLinear;
      goto LAB_00b0c73a;
    }
LAB_00b0c737:
    pcVar5 = scan;
LAB_00b0c73a:
    Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
    ::pushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                *)&self->field_0x58,pcVar5,currp);
    return;
  }
  if (lVar9 != 0) {
LAB_00b0c589:
    local_40 = scan;
    SmallVector<wasm::Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,void>>::Task,10ul>
    ::
    emplace_back<void(*&)(wasm::(anonymous_namespace)::ConstantGlobalApplier*,wasm::Expression**),wasm::Expression**&>
              ((SmallVector<wasm::Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,void>>::Task,10ul>
                *)&self->field_0x60,&local_40,(Expression ***)&local_38);
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

    auto handleCall = [&](bool isReturn) {
      if (!self->connectAdjacentBlocks) {
        // Control is nonlinear if we return, or if EH is enabled or may be.
        if (isReturn || !self->getModule() ||
            self->getModule()->features.hasExceptionHandling()) {
          self->pushTask(SubType::doNoteNonLinear, currp);
        }
      }

      // Scan the children normally.
      PostWalker<SubType, VisitorType>::scan(self, currp);
    };

    switch (curr->_id) {
      case Expression::Id::InvalidId:
        WASM_UNREACHABLE("bad id");
      case Expression::Id::BlockId: {
        self->pushTask(SubType::doVisitBlock, currp);
        if (curr->cast<Block>()->name.is()) {
          self->pushTask(SubType::doNoteNonLinear, currp);
        }
        auto& list = curr->cast<Block>()->list;
        for (int i = int(list.size()) - 1; i >= 0; i--) {
          self->pushTask(SubType::scan, &list[i]);
        }
        break;
      }
      case Expression::Id::IfId: {
        self->pushTask(SubType::doVisitIf, currp);
        self->pushTask(SubType::doNoteNonLinear, currp);
        self->maybePushTask(SubType::scan, &curr->cast<If>()->ifFalse);
        self->pushTask(SubType::doNoteNonLinear, currp);
        self->pushTask(SubType::scan, &curr->cast<If>()->ifTrue);
        if (!self->connectAdjacentBlocks) {
          self->pushTask(SubType::doNoteNonLinear, currp);
        }
        self->pushTask(SubType::scan, &curr->cast<If>()->condition);
        break;
      }
      case Expression::Id::LoopId: {
        self->pushTask(SubType::doVisitLoop, currp);
        self->pushTask(SubType::scan, &curr->cast<Loop>()->body);
        self->pushTask(SubType::doNoteNonLinear, currp);
        break;
      }
      case Expression::Id::BreakId: {
        self->pushTask(SubType::doVisitBreak, currp);
        auto* br = curr->cast<Break>();
        // If there is no condition then we note non-linearity as the code after
        // us is unreachable anyhow (we do the same for Switch, Return, etc.).
        // If there is a condition, then we note or do not note depending on
        // whether we allow adjacent blocks.
        if (!br->condition || !self->connectAdjacentBlocks) {
          self->pushTask(SubType::doNoteNonLinear, currp);
        }
        self->maybePushTask(SubType::scan, &br->condition);
        self->maybePushTask(SubType::scan, &br->value);
        break;
      }
      case Expression::Id::SwitchId: {
        self->pushTask(SubType::doVisitSwitch, currp);
        self->pushTask(SubType::doNoteNonLinear, currp);
        self->pushTask(SubType::scan, &curr->cast<Switch>()->condition);
        self->maybePushTask(SubType::scan, &curr->cast<Switch>()->value);
        break;
      }
      case Expression::Id::ReturnId: {
        self->pushTask(SubType::doVisitReturn, currp);
        self->pushTask(SubType::doNoteNonLinear, currp);
        self->maybePushTask(SubType::scan, &curr->cast<Return>()->value);
        break;
      }
      case Expression::Id::CallId: {
        handleCall(curr->cast<Call>()->isReturn);
        return;
      }
      case Expression::Id::CallRefId: {
        handleCall(curr->cast<CallRef>()->isReturn);
        return;
      }
      case Expression::Id::TryId: {
        self->pushTask(SubType::doVisitTry, currp);
        self->pushTask(SubType::doNoteNonLinear, currp);
        auto& list = curr->cast<Try>()->catchBodies;
        for (int i = int(list.size()) - 1; i >= 0; i--) {
          self->pushTask(SubType::scan, &list[i]);
          self->pushTask(SubType::doNoteNonLinear, currp);
        }
        self->pushTask(SubType::scan, &curr->cast<Try>()->body);
        break;
      }
      case Expression::Id::TryTableId: {
        self->pushTask(SubType::doVisitTryTable, currp);
        self->pushTask(SubType::doNoteNonLinear, currp);
        self->pushTask(SubType::scan, &curr->cast<TryTable>()->body);
        break;
      }
      case Expression::Id::ThrowId: {
        self->pushTask(SubType::doVisitThrow, currp);
        self->pushTask(SubType::doNoteNonLinear, currp);
        auto& list = curr->cast<Throw>()->operands;
        for (int i = int(list.size()) - 1; i >= 0; i--) {
          self->pushTask(SubType::scan, &list[i]);
        }
        break;
      }
      case Expression::Id::RethrowId: {
        self->pushTask(SubType::doVisitRethrow, currp);
        self->pushTask(SubType::doNoteNonLinear, currp);
        break;
      }
      case Expression::Id::UnreachableId: {
        self->pushTask(SubType::doVisitUnreachable, currp);
        self->pushTask(SubType::doNoteNonLinear, currp);
        break;
      }
      case Expression::Id::BrOnId: {
        self->pushTask(SubType::doVisitBrOn, currp);
        if (!self->connectAdjacentBlocks) {
          self->pushTask(SubType::doNoteNonLinear, currp);
        }
        self->pushTask(SubType::scan, &curr->cast<BrOn>()->ref);
        break;
      }
      default: {
        // All relevant things should have been handled.
        assert(!Properties::isControlFlowStructure(curr));
        assert(!Properties::isBranch(curr));
        // other node types do not have control flow, use regular post-order
        PostWalker<SubType, VisitorType>::scan(self, currp);
      }
    }
  }